

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::CreateFortranModuleDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *working_dir)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  string *__lhs;
  string target_mod_dir;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Fortran_MODULE_DIRECTORY",&local_61);
  pcVar2 = GetProperty(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (pcVar2 == (char *)0x0) {
    __lhs = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
    bVar1 = std::operator!=(__lhs,working_dir);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&local_60);
    }
  }
  else {
    std::__cxx11::string::assign((char *)&local_60);
  }
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_Fortran_MODDIR_FLAG",&local_61);
  pcVar2 = cmMakefile::GetDefinition(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if ((pcVar2 != (char *)0x0) && (local_60._M_string_length != 0)) {
    bVar1 = cmsys::SystemTools::FileIsFullPath(&local_60);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
    else {
      cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    cmsys::SystemTools::MakeDirectory(__return_storage_ptr__,(mode_t *)0x0);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::CreateFortranModuleDirectory(
  std::string const& working_dir) const
{
  std::string mod_dir;
  std::string target_mod_dir;
  if (const char* prop = this->GetProperty("Fortran_MODULE_DIRECTORY")) {
    target_mod_dir = prop;
  } else {
    std::string const& default_mod_dir =
      this->LocalGenerator->GetCurrentBinaryDirectory();
    if (default_mod_dir != working_dir) {
      target_mod_dir = default_mod_dir;
    }
  }
  const char* moddir_flag =
    this->Makefile->GetDefinition("CMAKE_Fortran_MODDIR_FLAG");
  if (!target_mod_dir.empty() && moddir_flag) {
    // Compute the full path to the module directory.
    if (cmSystemTools::FileIsFullPath(target_mod_dir)) {
      // Already a full path.
      mod_dir = target_mod_dir;
    } else {
      // Interpret relative to the current output directory.
      mod_dir = this->LocalGenerator->GetCurrentBinaryDirectory();
      mod_dir += "/";
      mod_dir += target_mod_dir;
    }

    // Make sure the module output directory exists.
    cmSystemTools::MakeDirectory(mod_dir);
  }
  return mod_dir;
}